

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void llvm::SmallVectorTemplateBase<char,true>::uninitialized_copy<char,char>
               (char *I,char *E,char *Dest,type *param_4)

{
  type *param_3_local;
  char *Dest_local;
  char *E_local;
  char *I_local;
  
  if (I != E) {
    memcpy(Dest,I,(long)E - (long)I);
  }
  return;
}

Assistant:

static void uninitialized_copy(
      T1 *I, T1 *E, T2 *Dest,
      typename std::enable_if<std::is_same<typename std::remove_const<T1>::type,
                                           T2>::value>::type * = nullptr) {
    // Use memcpy for PODs iterated by pointers (which includes SmallVector
    // iterators): std::uninitialized_copy optimizes to memmove, but we can
    // use memcpy here. Note that I and E are iterators and thus might be
    // invalid for memcpy if they are equal.
    if (I != E)
      memcpy(reinterpret_cast<void *>(Dest), I, (E - I) * sizeof(T));
  }